

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::AddEnvOpndForInnerFrameDisplay(IRBuilder *this,Instr *instr,uint offset)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  RegSlot srcRegSlot;
  RegSlot RVar5;
  JITTimeFunctionBody *this_00;
  RegOpnd *dstOpnd;
  undefined4 *puVar6;
  SymOpnd *src1Opnd;
  Instr *instr_00;
  
  srcRegSlot = GetEnvRegForInnerFrameDisplay(this);
  if (srcRegSlot != 0xffffffff) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    RVar5 = JITTimeFunctionBody::GetLocalFrameDisplayReg(this_00);
    if (((srcRegSlot == RVar5) && (pFVar1 = this->m_func, pFVar1->stackClosure == true)) &&
       (pFVar1->parentFunc == (Func *)0x0)) {
      dstOpnd = IR::RegOpnd::New(TyVar,pFVar1);
      src1Opnd = BuildFieldOpnd(this,LdSlot,(this->m_func->m_localFrameDisplaySym->super_Sym).m_id,0
                                ,0xffffffff,PropertyKindSlots,0xffffffff);
      instr_00 = IR::Instr::New(LdSlot,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
      AddInstr(this,instr_00,offset);
    }
    else {
      dstOpnd = BuildSrcOpnd(this,srcRegSlot,TyVar);
    }
    if (instr->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_004c847e;
      *puVar6 = 0;
    }
    pFVar1 = instr->m_func;
    if ((dstOpnd->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) {
LAB_004c847e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    bVar4 = (dstOpnd->super_Opnd).field_0xb;
    if ((bVar4 & 2) != 0) {
      dstOpnd = (RegOpnd *)IR::Opnd::Copy(&dstOpnd->super_Opnd,pFVar1);
      bVar4 = (dstOpnd->super_Opnd).field_0xb;
    }
    (dstOpnd->super_Opnd).field_0xb = bVar4 | 2;
    instr->m_src2 = &dstOpnd->super_Opnd;
  }
  return;
}

Assistant:

void
IRBuilder::AddEnvOpndForInnerFrameDisplay(IR::Instr *instr, uint offset)
{
    Js::RegSlot envReg = this->GetEnvRegForInnerFrameDisplay();
    if (envReg != Js::Constants::NoRegister)
    {
        IR::RegOpnd *src2Opnd;
        if (envReg == m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg() &&
            m_func->DoStackFrameDisplay() &&
            m_func->IsTopFunc())
        {
            src2Opnd = IR::RegOpnd::New(TyVar, m_func);
            this->AddInstr(
                IR::Instr::New(
                    Js::OpCode::LdSlot, src2Opnd,
                    this->BuildFieldOpnd(Js::OpCode::LdSlot, m_func->GetLocalFrameDisplaySym()->m_id, 0, (Js::PropertyIdIndexType)-1, PropertyKindSlots),
                    m_func),
                offset);
        }
        else
        {
            src2Opnd = this->BuildSrcOpnd(envReg);
        }
        instr->SetSrc2(src2Opnd);
    }
}